

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BiasLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BiasLayerParams>(Arena *arena)

{
  BiasLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (BiasLayerParams *)operator_new(0x38);
    CoreML::Specification::BiasLayerParams::BiasLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (BiasLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x38,(type_info *)&CoreML::Specification::BiasLayerParams::typeinfo);
    CoreML::Specification::BiasLayerParams::BiasLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }